

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O1

bool __thiscall
GenericModel::moveColumns
          (GenericModel *this,QModelIndex *sourceParent,int sourceColumn,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (**(code **)(*(long *)this + 0x80))();
  if ((-1 < (destinationChild | sourceColumn)) && (count + sourceColumn <= iVar2)) {
    if ((destinationParent->r == sourceParent->r) &&
       (((destinationParent->i == sourceParent->i && (destinationParent->c == sourceParent->c)) &&
        (destinationParent->m == sourceParent->m)))) {
      if (iVar2 < destinationChild) {
        return false;
      }
    }
    else {
      iVar2 = (**(code **)(*(long *)this + 0x80))(this,destinationParent);
      if (iVar2 < destinationChild) {
        return false;
      }
      iVar2 = (**(code **)(*(long *)this + 0x78))(this,sourceParent);
      iVar3 = (**(code **)(*(long *)this + 0x78))(this,destinationParent);
      if (iVar2 - iVar3 != 0 && iVar3 <= iVar2) {
        (**(code **)(*(long *)this + 0xf8))(this,iVar3,iVar2 - iVar3,destinationParent);
      }
    }
    cVar1 = QAbstractItemModel::beginMoveColumns
                      ((QModelIndex *)this,(int)sourceParent,sourceColumn,
                       (QModelIndex *)(ulong)((count + sourceColumn) - 1),(int)destinationParent);
    if (cVar1 != '\0') {
      if (((destinationParent->r == sourceParent->r) && (destinationParent->i == sourceParent->i))
         && ((destinationParent->c == sourceParent->c && (destinationParent->m == sourceParent->m)))
         ) {
        GenericModelPrivate::moveColumnsSameParent
                  (this->m_dptr,sourceParent,sourceColumn,count,destinationChild);
      }
      else {
        GenericModelPrivate::moveColumnsDifferentParent
                  (this->m_dptr,sourceParent,sourceColumn,count,destinationParent,destinationChild);
      }
      QAbstractItemModel::endMoveColumns();
      return true;
    }
  }
  return false;
}

Assistant:

bool GenericModel::moveColumns(const QModelIndex &sourceParent, int sourceColumn, int count, const QModelIndex &destinationParent,
                               int destinationChild)
{
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == this);
    Q_ASSERT(!destinationParent.isValid() || destinationParent.model() == this);
    const int colCnt = columnCount(sourceParent);
    if (destinationChild < 0 || sourceColumn < 0 || sourceColumn + count - 1 >= colCnt)
        return false;
    if (sourceParent != destinationParent) {
        if (destinationChild > columnCount(destinationParent))
            return false;
        const int sourceRowCount = rowCount(sourceParent);
        const int destRowCount = rowCount(destinationParent);
        if (sourceRowCount > destRowCount)
            insertRows(destRowCount, sourceRowCount - destRowCount, destinationParent);
    } else if (destinationChild > colCnt)
        return false;
    if (!beginMoveColumns(sourceParent, sourceColumn, sourceColumn + count - 1, destinationParent, destinationChild))
        return false;
    Q_D(GenericModel);
    if (sourceParent != destinationParent)
        d->moveColumnsDifferentParent(sourceParent, sourceColumn, count, destinationParent, destinationChild);
    else
        d->moveColumnsSameParent(sourceParent, sourceColumn, count, destinationChild);
    endMoveColumns();
    return true;
}